

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_info.cc
# Opt level: O2

absolute_lookup * __thiscall
absl::lts_20250127::time_internal::cctz::TimeZoneInfo::BreakTime
          (absolute_lookup *__return_storage_ptr__,TimeZoneInfo *this,time_point<seconds> *tp)

{
  pointer pTVar1;
  pointer pTVar2;
  long unix_time;
  long lVar3;
  ulong uVar4;
  Transition *pTVar5;
  long lVar6;
  fields fVar7;
  
  pTVar1 = (this->transitions_).
           super__Vector_base<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pTVar2 = (this->transitions_).
           super__Vector_base<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar6 = (long)pTVar2 - (long)pTVar1;
  if (lVar6 == 0) {
    __assert_fail("timecnt != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/time/internal/cctz/src/time_zone_info.cc"
                  ,0x376,
                  "virtual time_zone::absolute_lookup absl::time_internal::cctz::TimeZoneInfo::BreakTime(const time_point<seconds> &) const"
                 );
  }
  unix_time = (tp->__d).__r;
  if (unix_time < pTVar1->unix_time) {
    LocalTime(__return_storage_ptr__,this,unix_time,
              (this->transition_types_).
              super__Vector_base<absl::lts_20250127::time_internal::cctz::TransitionType,_std::allocator<absl::lts_20250127::time_internal::cctz::TransitionType>_>
              ._M_impl.super__Vector_impl_data._M_start + this->default_transition_type_);
  }
  else {
    lVar3 = *(long *)((long)pTVar1 + lVar6 + -0x30);
    if (unix_time < lVar3) {
      uVar4 = (this->local_time_hint_).super___atomic_base<unsigned_long>._M_i;
      if ((((uVar4 == 0) || ((ulong)(((long)pTVar2 - (long)pTVar1) / 0x30) <= uVar4)) ||
          (unix_time < pTVar1[uVar4 - 1].unix_time)) || (pTVar1[uVar4].unix_time <= unix_time)) {
        pTVar5 = std::
                 __upper_bound<absl::lts_20250127::time_internal::cctz::Transition_const*,absl::lts_20250127::time_internal::cctz::Transition,__gnu_cxx::__ops::_Val_comp_iter<absl::lts_20250127::time_internal::cctz::Transition::ByUnixTime>>
                           (pTVar1,lVar6 + (long)pTVar1);
        (this->local_time_hint_).super___atomic_base<unsigned_long>._M_i =
             ((long)pTVar5 - (long)pTVar1) / 0x30;
        pTVar5 = pTVar5 + -1;
      }
      else {
        pTVar5 = pTVar1 + (uVar4 - 1);
      }
    }
    else {
      if (this->extended_ == true) {
        (*(this->super_TimeZoneIf)._vptr_TimeZoneIf[2])(__return_storage_ptr__,this);
        fVar7 = (fields)anon_unknown_0::YearShift
                                  (&__return_storage_ptr__->cs,
                                   ((unix_time - lVar3) / 0x2f0605980 + 1) * 400);
        (__return_storage_ptr__->cs).f_ = fVar7;
        return __return_storage_ptr__;
      }
      pTVar5 = (Transition *)((long)pTVar1 + lVar6 + -0x30);
    }
    LocalTime(__return_storage_ptr__,this,unix_time,pTVar5);
  }
  return __return_storage_ptr__;
}

Assistant:

time_zone::absolute_lookup TimeZoneInfo::BreakTime(
    const time_point<seconds>& tp) const {
  std::int_fast64_t unix_time = ToUnixSeconds(tp);
  const std::size_t timecnt = transitions_.size();
  assert(timecnt != 0);  // We always add a transition.

  if (unix_time < transitions_[0].unix_time) {
    return LocalTime(unix_time, transition_types_[default_transition_type_]);
  }
  if (unix_time >= transitions_[timecnt - 1].unix_time) {
    // After the last transition. If we extended the transitions using
    // future_spec_, shift back to a supported year using the 400-year
    // cycle of calendaric equivalence and then compensate accordingly.
    if (extended_) {
      const std::int_fast64_t diff =
          unix_time - transitions_[timecnt - 1].unix_time;
      const year_t shift = diff / kSecsPer400Years + 1;
      const auto d = seconds(shift * kSecsPer400Years);
      time_zone::absolute_lookup al = BreakTime(tp - d);
      al.cs = YearShift(al.cs, shift * 400);
      return al;
    }
    return LocalTime(unix_time, transitions_[timecnt - 1]);
  }

  const std::size_t hint = local_time_hint_.load(std::memory_order_relaxed);
  if (0 < hint && hint < timecnt) {
    if (transitions_[hint - 1].unix_time <= unix_time) {
      if (unix_time < transitions_[hint].unix_time) {
        return LocalTime(unix_time, transitions_[hint - 1]);
      }
    }
  }

  const Transition target = {unix_time, 0, civil_second(), civil_second()};
  const Transition* begin = &transitions_[0];
  const Transition* tr = std::upper_bound(begin, begin + timecnt, target,
                                          Transition::ByUnixTime());
  local_time_hint_.store(static_cast<std::size_t>(tr - begin),
                         std::memory_order_relaxed);
  return LocalTime(unix_time, *--tr);
}